

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall TPZVec<float>::TPZVec(TPZVec<float> *this,initializer_list<float> *list)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  ulong uVar3;
  void *pvVar4;
  const_iterator pfVar5;
  initializer_list<float> *in_RSI;
  undefined8 *in_RDI;
  float *aux;
  const_iterator it_end;
  const_iterator it;
  size_type size;
  initializer_list<float> *in_stack_ffffffffffffffd0;
  float *pfVar6;
  const_iterator local_20;
  
  *in_RDI = &PTR__TPZVec_023d3088;
  in_RDI[1] = 0;
  sVar2 = std::initializer_list<float>::size(in_RSI);
  if (sVar2 != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    in_RDI[1] = pvVar4;
  }
  local_20 = std::initializer_list<float>::begin(in_RSI);
  pfVar5 = std::initializer_list<float>::end(in_stack_ffffffffffffffd0);
  pfVar6 = (float *)in_RDI[1];
  for (; local_20 != pfVar5; local_20 = local_20 + 1) {
    *pfVar6 = *local_20;
    pfVar6 = pfVar6 + 1;
  }
  in_RDI[2] = sVar2;
  in_RDI[3] = sVar2;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const std::initializer_list<T>& list) : fStore(nullptr) {
    const auto size = list.size();
	if (size > 0)
		fStore = new T[size];

	auto it = list.begin();
	auto it_end = list.end();
	T* aux = fStore;
	for (; it != it_end; it++, aux++)
		*aux = *it;

	fNElements = size;
    fNAlloc = size;
}